

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O1

bool hasValidValves(Network *nw)

{
  pointer ppLVar1;
  Link *pLVar2;
  pointer pcVar3;
  int iVar4;
  pointer ppLVar5;
  string local_60;
  NetworkError *local_40;
  
  ppLVar5 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppLVar1 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppLVar5 == ppLVar1) {
      return true;
    }
    pLVar2 = *ppLVar5;
    iVar4 = (*(pLVar2->super_Element)._vptr_Element[2])(pLVar2);
    if ((iVar4 == 2) &&
       (((pLVar2->toNode->fixedGrade == true &&
         (*(int *)&pLVar2[1].super_Element._vptr_Element == 0)) ||
        ((pLVar2->fromNode->fixedGrade == true &&
         (*(int *)&pLVar2[1].super_Element._vptr_Element == 1)))))) break;
    ppLVar5 = ppLVar5 + 1;
  }
  local_40 = (NetworkError *)__cxa_allocate_exception(0x30);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  pcVar3 = (pLVar2->super_Element).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + (pLVar2->super_Element).name._M_string_length);
  NetworkError::NetworkError(local_40,0,&local_60);
  __cxa_throw(local_40,&NetworkError::typeinfo,ENerror::~ENerror);
}

Assistant:

bool hasValidValves(Network* nw)
{
    bool result = true;
    for (Link* link : nw->links)
    {
        if ( link->type() != Link::VALVE ) continue;
        try
        {
            Valve* valve = static_cast<Valve*>(link);
            if ( (link->toNode->fixedGrade && valve->valveType == Valve::PRV) ||
                 (link->fromNode->fixedGrade && valve->valveType == Valve::PSV) )
            {
                throw NetworkError(NetworkError::ILLEGAL_VALVE_CONNECTION,
                                   valve->name);
            }
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
            result = false;
        }

//////////  TO DO: Add checks for valves in series, etc.  ////////////////

    }
    return result;

}